

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O3

Expression __thiscall cnn::RNNBuilder::add_input(RNNBuilder *this,Expression *x)

{
  uint uVar1;
  iterator __position;
  undefined8 extraout_RDX;
  RNNPointer *pRVar2;
  Expression EVar3;
  
  RNNStateMachine::transition((RNNStateMachine *)&x->field_0xc,add_input);
  __position._M_current = *(RNNPointer **)&x[1].i;
  if ((ComputationGraph *)__position._M_current == x[2].pg) {
    std::vector<cnn::RNNPointer,std::allocator<cnn::RNNPointer>>::
    _M_realloc_insert<cnn::RNNPointer_const&>
              ((vector<cnn::RNNPointer,std::allocator<cnn::RNNPointer>> *)(x + 1),__position,
               (RNNPointer *)&x->i);
    uVar1 = (x->i).t;
    pRVar2 = *(RNNPointer **)&x[1].i;
  }
  else {
    uVar1 = (x->i).t;
    (__position._M_current)->t = uVar1;
    pRVar2 = __position._M_current + 1;
    *(RNNPointer **)&x[1].i = pRVar2;
  }
  (x->i).t = (int)((ulong)((long)pRVar2 - (long)x[1].pg) >> 2) - 1;
  (*(code *)x->pg[1].parameter_nodes.
            super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
            super__Vector_impl_data._M_finish)(this,x,uVar1);
  EVar3._8_8_ = extraout_RDX;
  EVar3.pg = (ComputationGraph *)this;
  return EVar3;
}

Assistant:

Expression add_input(const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(cur);
    int rcp = cur;
    cur = head.size() - 1;
    return add_input_impl(rcp, x);
  }